

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O2

ComponentPtr __thiscall
libcellml::ComponentEntity::takeComponent(ComponentEntity *this,size_t index)

{
  long lVar1;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ComponentImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ComponentPtr CVar3;
  
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = (_func_int **)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)0x0;
  lVar1 = *(long *)(index + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(lVar1 + 0x58) - *(long *)(lVar1 + 0x50) >> 4)) {
    p_Var2 = &std::
              vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
              ::at((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                    *)(lVar1 + 0x50),(size_type)in_RDX._M_pi)->
              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             *)(*(long *)(index + 8) + 0x50),
            (shared_ptr<libcellml::Component> *)
            ((long)in_RDX._M_pi * 0x10 + *(long *)(*(long *)(index + 8) + 0x50)));
    this_00 = Component::pFunc((Component *)
                               (this->super_NamedEntity).super_ParentedEntity.super_Entity.
                               _vptr_Entity);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_00);
    in_RDX._M_pi = extraout_RDX;
  }
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr ComponentEntity::takeComponent(size_t index)
{
    ComponentPtr component = nullptr;
    if (index < pFunc()->mComponents.size()) {
        component = pFunc()->mComponents.at(index);
        pFunc()->mComponents.erase(pFunc()->mComponents.begin() + ptrdiff_t(index));
        component->pFunc()->removeParent();
    }

    return component;
}